

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondResultTest.cpp
# Opt level: O2

void __thiscall CondResultTest::CondResultTest(CondResultTest *this)

{
  char local_cb [2];
  allocator<char> local_c9;
  bool local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  shared_ptr<oout::CondResult> local_b8;
  shared_ptr<oout::CountFailure> local_a8;
  shared_ptr<CountFailureRepr> local_98;
  shared_ptr<const_oout::NamedTest> local_88;
  bool local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  shared_ptr<oout::CondResult> local_68;
  shared_ptr<oout::CountFailure> local_58;
  shared_ptr<CountFailureRepr> local_48;
  shared_ptr<const_oout::NamedTest> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CondResult test",&local_c9);
  local_cb[1] = '\x01';
  std::make_shared<oout::CondResult,bool,char_const(&)[8]>(local_78,(char (*) [8])(local_cb + 1));
  std::make_shared<oout::CountFailure,std::shared_ptr<oout::CondResult>>(&local_68);
  std::make_shared<CountFailureRepr,std::shared_ptr<oout::CountFailure>>(&local_58);
  std::make_shared<oout::EqualTest,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_48,(char (*) [2])&local_58);
  std::make_shared<oout::NamedTest_const,char_const(&)[34],std::shared_ptr<oout::EqualTest>>
            ((char (*) [34])&local_38,
             (shared_ptr<oout::EqualTest> *)"CondResult succes if cond is true");
  local_cb[0] = '\0';
  std::make_shared<oout::CondResult,bool,char_const(&)[8]>(local_c8,(char (*) [8])local_cb);
  std::make_shared<oout::CountFailure,std::shared_ptr<oout::CondResult>>(&local_b8);
  std::make_shared<CountFailureRepr,std::shared_ptr<oout::CountFailure>>(&local_a8);
  std::make_shared<oout::EqualTest,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_98,(char (*) [2])&local_a8);
  std::make_shared<oout::NamedTest_const,char_const(&)[36],std::shared_ptr<oout::EqualTest>>
            ((char (*) [36])&local_88,
             (shared_ptr<oout::EqualTest> *)"CondResult failure if cond is false");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_28,&local_38,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cb3d8;
  return;
}

Assistant:

CondResultTest::CondResultTest()
: dirty::Test(
	"CondResult test",
	make_shared<const NamedTest>(
		"CondResult succes if cond is true",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(true, "success")
				)
			),
			"0"
		)
	),
	make_shared<const NamedTest>(
		"CondResult failure if cond is false",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(false, "failure")
				)
			),
			"1"
		)
	)
)
{
}